

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::TestOutputStream::~TestOutputStream(TestOutputStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_OutputStream)._vptr_OutputStream = (_func_int **)&PTR__TestOutputStream_00378b38;
  pcVar2 = (this->data)._M_dataplus._M_p;
  paVar1 = &(this->data).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  kj::ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)this);
  return;
}

Assistant:

~TestOutputStream() {}